

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2SharingRandomTest::~GLES2SharingRandomTest(GLES2SharingRandomTest *this)

{
  GLES2SharingRandomTest *this_local;
  
  ~GLES2SharingRandomTest(this);
  operator_delete(this,0x2420);
  return;
}

Assistant:

GLES2SharingRandomTest::~GLES2SharingRandomTest (void)
{
	GLES2SharingRandomTest::deinit();
}